

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Event::Event(Event *this,string_view name)

{
  Event *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (Event *)name.data_;
  string_view::to_string_abi_cxx11_(&this->name,(string_view *)&this_local);
  FuncDeclaration::FuncDeclaration(&this->decl);
  return;
}

Assistant:

explicit Event(string_view name) : name(name.to_string()) {}